

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O0

int XPMPGetPlaneModelName(XPMPPlaneID inPlaneID,char *outTxtBuf,int outTxtBufSize)

{
  Aircraft *pAVar1;
  string *psVar2;
  char *__src;
  int in_EDX;
  char *in_RSI;
  string mdlName;
  Aircraft *pAc;
  Aircraft *in_stack_ffffffffffffffc0;
  XPMPPlaneID in_stack_ffffffffffffffdc;
  int local_4;
  
  pAVar1 = XPMP2::AcFindByID(in_stack_ffffffffffffffdc);
  if (pAVar1 == (Aircraft *)0x0) {
    local_4 = -1;
  }
  else {
    psVar2 = XPMP2::Aircraft::GetModelName_abi_cxx11_(in_stack_ffffffffffffffc0);
    std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,(string *)psVar2);
    if ((in_RSI != (char *)0x0) && (0 < in_EDX)) {
      __src = (char *)std::__cxx11::string::c_str();
      strncpy(in_RSI,__src,(long)in_EDX);
      in_RSI[in_EDX + -1] = '\0';
    }
    local_4 = std::__cxx11::string::length();
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  }
  return local_4;
}

Assistant:

int     XPMPGetPlaneModelName(XPMPPlaneID             inPlaneID,
                              char *                  outTxtBuf,
                              int                     outTxtBufSize)
{
    Aircraft* pAc = AcFindByID(inPlaneID);
    if (pAc) {
        std::string mdlName = pAc->GetModelName();
        if (outTxtBuf && outTxtBufSize > 0) {
            strncpy(outTxtBuf, mdlName.c_str(), (size_t)outTxtBufSize);
            outTxtBuf[outTxtBufSize-1] = 0;         // safety measure: ensure zero-termination
        }
        return (int)mdlName.length();
    } else {
        return -1;
    }
}